

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cpp
# Opt level: O2

string * duckdb::StringUtil::Upper(string *__return_storage_ptr__,string *str)

{
  pointer pcVar1;
  size_type sVar2;
  int iVar3;
  size_type sVar4;
  
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)str);
  pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
  sVar2 = __return_storage_ptr__->_M_string_length;
  for (sVar4 = 0; sVar2 != sVar4; sVar4 = sVar4 + 1) {
    iVar3 = toupper((uint)(byte)pcVar1[sVar4]);
    pcVar1[sVar4] = (char)iVar3;
  }
  return __return_storage_ptr__;
}

Assistant:

string StringUtil::Upper(const string &str) {
	string copy(str);
	transform(copy.begin(), copy.end(), copy.begin(), [](unsigned char c) { return std::toupper(c); });
	return (copy);
}